

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void recfield(LexState *ls,ConsControl *cc)

{
  lu_byte lVar1;
  int a;
  FuncState *fs;
  int b;
  int c;
  expdesc key;
  expdesc val;
  
  fs = ls->fs;
  lVar1 = fs->freereg;
  if ((ls->t).token == 0x124) {
    checklimit(fs,cc->nh,0x7fffffff,"items in a constructor");
    checkname(ls,&key);
  }
  else {
    yindex(ls,&key);
  }
  cc->nh = cc->nh + 1;
  checknext(ls,0x3d);
  b = luaK_exp2RK(fs,&key);
  expr(ls,&val);
  a = (cc->t->u).info;
  c = luaK_exp2RK(fs,&val);
  luaK_codeABC(fs,OP_SETTABLE,a,b,c);
  fs->freereg = lVar1;
  return;
}

Assistant:

static void recfield (LexState *ls, struct ConsControl *cc) {
  /* recfield -> (NAME | '['exp1']') = exp1 */
  FuncState *fs = ls->fs;
  int reg = ls->fs->freereg;
  expdesc key, val;
  int rkkey;
  if (ls->t.token == TK_NAME) {
    checklimit(fs, cc->nh, MAX_INT, "items in a constructor");
    checkname(ls, &key);
  }
  else  /* ls->t.token == '[' */
    yindex(ls, &key);
  cc->nh++;
  checknext(ls, '=');
  rkkey = luaK_exp2RK(fs, &key);
  expr(ls, &val);
  luaK_codeABC(fs, OP_SETTABLE, cc->t->u.info, rkkey, luaK_exp2RK(fs, &val));
  fs->freereg = reg;  /* free registers */
}